

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_HealObj(FParser *this)

{
  int iVar1;
  AActor *pAVar2;
  AActor *local_18;
  AActor *mo;
  FParser *this_local;
  
  if (this->t_argc == 0) {
    local_18 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->Script->trigger);
  }
  else {
    local_18 = actorvalue(this->t_argv);
  }
  if (this->t_argc < 2) {
    pAVar2 = AActor::GetDefault(local_18);
    local_18->health = pAVar2->health;
    if (local_18->player != (player_t *)0x0) {
      local_18->player->health = local_18->health;
    }
  }
  else if (this->t_argc == 2) {
    iVar1 = intvalue(this->t_argv + 1);
    local_18->health = iVar1 + local_18->health;
    if (local_18->player != (player_t *)0x0) {
      local_18->player->health = local_18->health;
    }
  }
  else {
    script_error("invalid number of arguments for objheal");
  }
  return;
}

Assistant:

void FParser::SF_HealObj()  //no pain sound
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;
	}

	if(t_argc < 2)
	{
		mo->health = mo->GetDefault()->health;
		if(mo->player) mo->player->health = mo->health;
	}

	else if (t_argc == 2)
	{
		mo->health += intvalue(t_argv[1]);
		if(mo->player) mo->player->health = mo->health;
	}

	else
		script_error("invalid number of arguments for objheal");
}